

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::FirstLineOf_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view value)

{
  ulong uVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,value._M_len,this + value._M_len,value._M_str);
  uVar1 = std::__cxx11::string::find((char)__return_storage_ptr__,10);
  if (uVar1 != 0xffffffffffffffff) {
    if (__return_storage_ptr__->_M_string_length < uVar1) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                 uVar1);
    }
    __return_storage_ptr__->_M_string_length = uVar1;
    (__return_storage_ptr__->_M_dataplus)._M_p[uVar1] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string FirstLineOf(absl::string_view value) {
  std::string result(value);

  std::string::size_type pos = result.find_first_of('\n');
  if (pos != std::string::npos) {
    result.erase(pos);
  }

  return result;
}